

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3TruncateNode(char *aNode,int nNode,Blob *pNew,char *zTerm,int nTerm,sqlite3_int64 *piBlock)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  NodeReader reader;
  Blob prev;
  int local_84;
  NodeReader local_80;
  Blob local_48;
  
  local_48.a = (char *)0x0;
  local_48.n = 0;
  local_48.nAlloc = 0;
  local_84 = 0;
  cVar1 = *aNode;
  blobGrowBuffer(pNew,nNode,&local_84);
  iVar6 = local_84;
  if (local_84 == 0) {
    pNew->n = 0;
    iVar6 = nodeReaderInit(&local_80,aNode,nNode);
    if ((iVar6 == 0) && (local_80.aNode != (char *)0x0)) {
      do {
        iVar6 = local_80.term.n;
        pcVar3 = local_80.term.a;
        if (pNew->n == 0) {
          iVar11 = local_80.term.n - nTerm;
          iVar7 = nTerm;
          if (local_80.term.n < nTerm) {
            iVar7 = local_80.term.n;
          }
          iVar7 = memcmp(local_80.term.a,zTerm,(long)iVar7);
          if (iVar7 != 0) {
            iVar11 = iVar7;
          }
          if ((-1 < iVar11) && (cVar1 == '\0' || iVar11 != 0)) {
            *pNew->a = *aNode;
            if (local_80.iChild == 0) {
              lVar9 = 1;
            }
            else {
              pcVar2 = pNew->a;
              lVar9 = 1;
              uVar10 = local_80.iChild;
              do {
                lVar8 = lVar9;
                bVar5 = (byte)uVar10;
                pcVar2[lVar8] = bVar5 | 0x80;
                lVar9 = lVar8 + 1;
                bVar4 = 0x7f < uVar10;
                uVar10 = uVar10 >> 7;
              } while (bVar4);
              pcVar2[lVar8] = bVar5;
            }
            pNew->n = (int)lVar9;
            *piBlock = local_80.iChild;
            goto LAB_001da2b6;
          }
        }
        else {
LAB_001da2b6:
          iVar6 = fts3AppendToNode(pNew,&local_48,pcVar3,iVar6,local_80.aDoclist,local_80.nDoclist);
          if (iVar6 != 0) break;
        }
        iVar6 = nodeReaderNext(&local_80);
        if ((iVar6 != 0) || (local_80.aNode == (char *)0x0)) break;
      } while( true );
    }
    if (pNew->n == 0) {
      *pNew->a = *aNode;
      if (local_80.iChild == 0) {
        lVar9 = 1;
      }
      else {
        pcVar3 = pNew->a;
        lVar9 = 1;
        uVar10 = local_80.iChild;
        do {
          lVar8 = lVar9;
          bVar5 = (byte)uVar10;
          pcVar3[lVar8] = bVar5 | 0x80;
          lVar9 = lVar8 + 1;
          bVar4 = 0x7f < uVar10;
          uVar10 = uVar10 >> 7;
        } while (bVar4);
        pcVar3[lVar8] = bVar5;
      }
      pNew->n = (int)lVar9;
      *piBlock = local_80.iChild;
    }
    sqlite3_free(local_80.term.a);
    sqlite3_free(local_48.a);
  }
  return iVar6;
}

Assistant:

static int fts3TruncateNode(
  const char *aNode,              /* Current node image */
  int nNode,                      /* Size of aNode in bytes */
  Blob *pNew,                     /* OUT: Write new node image here */
  const char *zTerm,              /* Omit all terms smaller than this */
  int nTerm,                      /* Size of zTerm in bytes */
  sqlite3_int64 *piBlock          /* OUT: Block number in next layer down */
){
  NodeReader reader;              /* Reader object */
  Blob prev = {0, 0, 0};          /* Previous term written to new node */
  int rc = SQLITE_OK;             /* Return code */
  int bLeaf = aNode[0]=='\0';     /* True for a leaf node */

  /* Allocate required output space */
  blobGrowBuffer(pNew, nNode, &rc);
  if( rc!=SQLITE_OK ) return rc;
  pNew->n = 0;

  /* Populate new node buffer */
  for(rc = nodeReaderInit(&reader, aNode, nNode); 
      rc==SQLITE_OK && reader.aNode; 
      rc = nodeReaderNext(&reader)
  ){
    if( pNew->n==0 ){
      int res = fts3TermCmp(reader.term.a, reader.term.n, zTerm, nTerm);
      if( res<0 || (bLeaf==0 && res==0) ) continue;
      fts3StartNode(pNew, (int)aNode[0], reader.iChild);
      *piBlock = reader.iChild;
    }
    rc = fts3AppendToNode(
        pNew, &prev, reader.term.a, reader.term.n,
        reader.aDoclist, reader.nDoclist
    );
    if( rc!=SQLITE_OK ) break;
  }
  if( pNew->n==0 ){
    fts3StartNode(pNew, (int)aNode[0], reader.iChild);
    *piBlock = reader.iChild;
  }
  assert( pNew->n<=pNew->nAlloc );

  nodeReaderRelease(&reader);
  sqlite3_free(prev.a);
  return rc;
}